

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O0

void __thiscall CMenus::CMenus(CMenus *this)

{
  _func_int **pp_Var1;
  CComponent *in_RDI;
  int Type;
  char *in_stack_ffffffffffffff58;
  CMenusKeyBinder *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  int NewPage;
  CMenus *in_stack_ffffffffffffff70;
  CComponent *local_48;
  int local_18;
  
  CComponent::CComponent(in_RDI);
  in_RDI->_vptr_CComponent = (_func_int **)&PTR__CMenus_00298f00;
  vector2_base<float>::vector2_base((vector2_base<float> *)&in_RDI[2].m_pClient);
  vector2_base<float>::vector2_base((vector2_base<float> *)(in_RDI + 3));
  array<CMenus::CMenuImage,_allocator_default<CMenus::CMenuImage>_>::array
            ((array<CMenus::CMenuImage,_allocator_default<CMenus::CMenuImage>_> *)0x171554);
  sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::sorted_array
            ((sorted_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_> *)0x17156f);
  array<CMenus::CGameIcon,_allocator_default<CMenus::CGameIcon>_>::array
            ((array<CMenus::CGameIcon,_allocator_default<CMenus::CGameIcon>_> *)0x17158a);
  IGraphics::CTextureHandle::CTextureHandle((CTextureHandle *)&in_RDI[0x2a].m_pClient);
  sorted_array<CMenus::CDemoItem,_allocator_default<CMenus::CDemoItem>_>::sorted_array
            ((sorted_array<CMenus::CDemoItem,_allocator_default<CMenus::CDemoItem>_> *)0x1715bb);
  local_48 = in_RDI + 0xaa;
  do {
    sorted_array<CMenus::CFriendItem,_allocator_default<CMenus::CFriendItem>_>::sorted_array
              ((sorted_array<CMenus::CFriendItem,_allocator_default<CMenus::CFriendItem>_> *)
               0x1715f0);
    NewPage = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    local_48 = local_48 + 1;
  } while (local_48 != in_RDI + 0xad);
  array<CMenus::CBrowserFilter,_allocator_default<CMenus::CBrowserFilter>_>::array
            ((array<CMenus::CBrowserFilter,_allocator_default<CMenus::CBrowserFilter>_> *)0x171623);
  sorted_array<CVideoMode,_allocator_default<CVideoMode>_>::sorted_array
            ((sorted_array<CVideoMode,_allocator_default<CVideoMode>_> *)0x17163e);
  sorted_array<CVideoMode,_allocator_default<CVideoMode>_>::sorted_array
            ((sorted_array<CVideoMode,_allocator_default<CVideoMode>_> *)0x171659);
  CMenusKeyBinder::CMenusKeyBinder(in_stack_ffffffffffffff60);
  *(undefined4 *)((long)&in_RDI[1]._vptr_CComponent + 4) = 0;
  *(undefined4 *)&in_RDI[1].m_pClient = 5;
  *(undefined4 *)&in_RDI[1]._vptr_CComponent = 1;
  *(undefined4 *)((long)&in_RDI[0xae].m_pClient + 4) = 0;
  *(undefined1 *)&in_RDI[0xaf]._vptr_CComponent = 1;
  *(undefined1 *)((long)&in_RDI[0xaf]._vptr_CComponent + 1) = 1;
  *(undefined4 *)((long)&in_RDI[0xaf]._vptr_CComponent + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0xb0].m_pClient = 0;
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    *(undefined4 *)((long)&in_RDI[0xaf].m_pClient + (long)local_18 * 4) = 0xfffffffe;
    *(undefined4 *)((long)&in_RDI[0xb0]._vptr_CComponent + (long)local_18 * 4) = 0xffffffff;
  }
  *(undefined1 *)((long)&in_RDI[0x2b].m_pClient + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0x2b].m_pClient + 2) = 0;
  *(undefined1 *)&in_RDI[0x2b].m_pClient = 0;
  *(undefined4 *)((long)&in_RDI[0x2b].m_pClient + 4) = 0;
  *(undefined1 *)&in_RDI[0x2c]._vptr_CComponent = 0;
  *(undefined1 *)((long)&in_RDI[0x32]._vptr_CComponent + 1) = 1;
  in_RDI[0x32].m_pClient = (CGameClient *)0x0;
  *(undefined1 *)((long)&in_RDI[2]._vptr_CComponent + 4) = 1;
  in_RDI[0xa9]._vptr_CComponent = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[0xa9].m_pClient = 1;
  *(undefined1 *)&in_RDI[4]._vptr_CComponent = 0;
  *(undefined1 *)((long)&in_RDI[4]._vptr_CComponent + 1) = 0;
  *(undefined1 *)((long)&in_RDI[4]._vptr_CComponent + 2) = 0;
  SetMenuPage(in_stack_ffffffffffffff70,NewPage);
  *(undefined4 *)&in_RDI[2]._vptr_CComponent = 10;
  *(undefined1 *)&in_RDI[0x34]._vptr_CComponent = 0;
  *(undefined1 *)((long)&in_RDI[0x54]._vptr_CComponent + 4) = 0;
  pp_Var1 = (_func_int **)time_get();
  in_RDI[0x2b]._vptr_CComponent = pp_Var1;
  str_copy((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
  *(undefined1 *)&in_RDI[0x66]._vptr_CComponent = 0;
  *(undefined1 *)&in_RDI[0x65]._vptr_CComponent = 0;
  *(undefined4 *)&in_RDI[3].m_pClient = 0;
  *(undefined4 *)((long)&in_RDI[3].m_pClient + 4) = 0xfffffffe;
  return;
}

Assistant:

CMenus::CMenus()
{
	m_Popup = POPUP_NONE;
	m_ActivePage = PAGE_INTERNET;
	m_GamePage = PAGE_GAME;

	m_SidebarTab = 0;
	m_SidebarActive = true;
	m_ShowServerDetails = true;
	m_LastBrowserType = -1;
	m_AddressSelection = 0;
	for(int Type = 0; Type < IServerBrowser::NUM_TYPES; Type++)
	{
		m_aSelectedFilters[Type] = -2;
		m_aSelectedServers[Type] = -1;
	}

	m_NeedRestartGraphics = false;
	m_NeedRestartSound = false;
	m_NeedRestartPlayer = false;
	m_TeePartSelected = SKINPART_BODY;
	m_aSaveSkinName[0] = 0;
	m_RefreshSkinSelector = true;
	m_pSelectedSkin = 0;
	m_MenuActive = true;
	m_SeekBarActivatedTime = 0;
	m_SeekBarActive = true;
	m_SkinModified = false;
	m_KeyReaderWasActive = false;
	m_KeyReaderIsActive = false;

	SetMenuPage(PAGE_START);
	m_MenuPageOld = PAGE_START;

	m_aDemoLoadingFile[0] = 0;
	m_DemoLoadingPopupRendered = false;

	m_LastInput = time_get();

	str_copy(m_aCurrentDemoFolder, "demos", sizeof(m_aCurrentDemoFolder));
	m_aCallvoteReason[0] = 0;
	m_aFilterString[0] = 0;

	m_ActiveListBox = ACTLB_NONE;

	m_PopupCountrySelection = -2;
}